

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  char **ppcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  dircnt_t *dirptr;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  img_fol_t img_fol;
  char image_filename [4096];
  opj_cparameters_t parameters;
  char outfilename [4096];
  char infilename [4096];
  char temp_ofname [4096];
  char indexfilename [4096];
  size_t in_stack_ffffffffffff5638;
  opj_image_t *local_a9c0;
  dircnt_t *local_a9b8;
  uint local_a9ac;
  long local_a9a0;
  undefined1 local_a998 [16];
  undefined8 local_a988;
  double local_a980;
  undefined1 local_a978 [16];
  OPJ_BOOL local_a968;
  raw_comp_cparameters_t *local_a960;
  rusage local_a958 [28];
  opj_cparameters_t local_9958;
  char local_5038;
  char acStack_5037 [4095];
  char local_4038;
  char acStack_4037 [4095];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  local_a9b8 = (dircnt_t *)0x0;
  getrusage(RUSAGE_SELF,(rusage *)&local_9958);
  opj_set_default_encoder_parameters(&local_9958);
  local_2038[0] = '\0';
  local_a998 = (undefined1  [16])0x0;
  local_a988._0_1_ = '\0';
  local_a988._1_1_ = '\0';
  local_a988._2_6_ = 0;
  local_a960 = (raw_comp_cparameters_t *)0x0;
  local_a978 = (undefined1  [16])0x0;
  local_a968 = 0;
  local_9958.tcp_mct = -1;
  iVar1 = parse_cmdline_encoder
                    (argc,argv,&local_9958,(img_fol_t *)local_a998,(raw_cparameters_t *)local_a978,
                     local_2038,in_stack_ffffffffffff5638);
  iVar9 = 1;
  if (iVar1 == 1) goto LAB_00106797;
  if ((char)local_a988 == '\x01') {
    uVar3 = local_a998._0_8_;
    __dirp = opendir((char *)local_a998._0_8_);
    if (__dirp == (DIR *)0x0) {
      uVar11 = 0;
      fprintf(_stderr,"Could not open Folder %s\n",uVar3);
    }
    else {
      pdVar2 = readdir(__dirp);
      uVar11 = 0;
      while (pdVar2 != (dirent *)0x0) {
        if ((byte)pdVar2->d_name[0] == 0x2e) {
          if (pdVar2->d_name[1] != 0) {
            uVar7 = (byte)pdVar2->d_name[1] - 0x2e;
            if (uVar7 == 0) {
              uVar7 = (uint)(byte)pdVar2->d_name[2];
            }
            iVar1 = -uVar7;
            goto LAB_00105f57;
          }
        }
        else {
          iVar1 = 0x2e - (uint)(byte)pdVar2->d_name[0];
LAB_00105f57:
          if (iVar1 != 0) {
            uVar11 = uVar11 + 1;
          }
        }
        pdVar2 = readdir(__dirp);
      }
      closedir(__dirp);
    }
    local_a9b8 = (dircnt_t *)malloc(0x10);
    if (local_a9b8 == (dircnt_t *)0x0) {
      dirptr = (dircnt_t *)0x0;
    }
    else {
      pcVar5 = (char *)malloc((ulong)(uVar11 << 0xc));
      local_a9b8->filename_buf = pcVar5;
      uVar10 = (ulong)uVar11;
      ppcVar6 = (char **)malloc(uVar10 * 8);
      local_a9b8->filename = ppcVar6;
      auVar14 = _DAT_00114040;
      if (pcVar5 == (char *)0x0) {
        iVar9 = 0;
        goto LAB_00106797;
      }
      dirptr = local_a9b8;
      if (uVar11 != 0) {
        lVar4 = uVar10 - 1;
        auVar12._8_4_ = (int)lVar4;
        auVar12._0_8_ = lVar4;
        auVar12._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar8 = 0;
        auVar12 = auVar12 ^ _DAT_00114040;
        auVar13 = _DAT_00114030;
        do {
          auVar15 = auVar13 ^ auVar14;
          uVar16 = auVar13._8_8_;
          if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                      auVar12._4_4_ < auVar15._4_4_) & 1)) {
            *(char **)((long)ppcVar6 + uVar8) = pcVar5 + (auVar13._0_8_ & 0xfffff) * 0x1000;
          }
          if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
              auVar15._12_4_ <= auVar12._12_4_) {
            *(char **)((long)ppcVar6 + uVar8 + 8) = pcVar5 + (uVar16 & 0xfffff) * 0x1000;
          }
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = uVar16 + 2;
          uVar8 = uVar8 + 0x10;
        } while ((uVar10 * 8 + 8 & 0xfffffffffffffff0) != uVar8);
      }
    }
    iVar1 = load_images(dirptr,(char *)uVar3);
    iVar9 = 0;
    if (iVar1 != 0) goto LAB_00106797;
    if (uVar11 == 0) {
      fwrite("Folder is empty\n",0x10,1,_stdout);
      goto LAB_00106797;
    }
  }
  else {
    uVar11 = 1;
    local_a9b8 = (dircnt_t *)0x0;
  }
  local_a980 = (double)(long)(local_9958._24_8_ + local_9958._8_8_) * 1e-06 +
               (double)(long)(local_9958._16_8_ + local_9958._0_8_);
  local_a9ac = 0;
  local_a9a0 = 0;
  do {
    fputc(10,_stderr);
    if ((char)local_a988 != '\x01') {
LAB_00105ff1:
      switch(local_9958.decod_format) {
      case 10:
        local_a9c0 = pnmtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 == (opj_image_t *)0x0) {
          main_cold_7();
        }
        else {
LAB_00106125:
          if (local_9958.tcp_mct == '\x01') {
            if (local_a9c0->numcomps < 3) {
              main_cold_8();
              break;
            }
          }
          else if (local_9958.tcp_mct == -1) {
            local_9958.tcp_mct = 2 < local_a9c0->numcomps;
          }
          else if ((local_9958.tcp_mct == '\x02') && (local_9958.mct_data == (void *)0x0)) {
            main_cold_9();
            break;
          }
          iVar1 = local_9958.cod_format;
          if (local_9958.cod_format != 0) {
            if (local_9958.cod_format != 1) {
              main_cold_14();
              goto LAB_00106297;
            }
            iVar1 = 2;
          }
          uVar3 = opj_create_compress(iVar1);
          opj_set_info_handler(uVar3,info_callback,0);
          opj_set_warning_handler(uVar3,warning_callback,0);
          opj_set_error_handler(uVar3,error_callback,0);
          iVar1 = opj_setup_encoder(uVar3,&local_9958,local_a9c0);
          if (iVar1 != 0) {
            lVar4 = opj_stream_create_default_file_stream(local_9958.outfile,0);
            iVar9 = 1;
            if (lVar4 != 0) {
              iVar1 = opj_start_compress(uVar3,local_a9c0,lVar4);
              if (iVar1 == 0) {
                main_cold_10();
LAB_00106725:
                main_cold_11();
              }
              else {
                iVar1 = opj_encode(uVar3,lVar4);
                if (iVar1 == 0) goto LAB_00106725;
                iVar1 = opj_end_compress(uVar3,lVar4);
                if (iVar1 != 0) {
                  local_a9a0 = local_a9a0 + 1;
                  fprintf(_stdout,"[INFO] Generated outfile %s\n",local_9958.outfile);
                  opj_stream_destroy(lVar4);
                  opj_destroy_codec(uVar3);
                  opj_image_destroy();
                  goto LAB_00106297;
                }
              }
              main_cold_12();
              iVar9 = 1;
            }
            goto LAB_00106797;
          }
          main_cold_13();
        }
        break;
      case 0xb:
        local_a9c0 = pgxtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_15();
        break;
      case 0xc:
        local_a9c0 = bmptoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_6();
        break;
      default:
        main_cold_16();
        goto LAB_00106297;
      case 0xe:
        local_a9c0 = tiftoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_5();
        break;
      case 0xf:
        local_a9c0 = rawtoimage(local_9958.infile,&local_9958,(raw_cparameters_t *)local_a978);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_4();
        break;
      case 0x10:
        local_a9c0 = tgatoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_2();
        break;
      case 0x11:
        local_a9c0 = pngtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_1();
        break;
      case 0x12:
        local_a9c0 = rawltoimage(local_9958.infile,&local_9958,(raw_cparameters_t *)local_a978);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_00106125;
        main_cold_3();
      }
      iVar9 = 1;
      goto LAB_00106797;
    }
    ppcVar6 = local_a9b8->filename;
    memset(local_1038,0,0x1000);
    strcpy((char *)local_a958,ppcVar6[(int)local_a9ac]);
    fprintf(_stderr,"File Number %d \"%s\"\n",(ulong)local_a9ac,local_a958);
    local_9958.decod_format = get_file_format((char *)local_a958);
    if (local_9958.decod_format != -1) {
      uVar3 = local_a998._0_8_;
      sprintf(&local_4038,"%s/%s",local_a998._0_8_,local_a958);
      if (local_4038 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        do {
          uVar8 = uVar10;
          uVar10 = uVar8 + 1;
          if (acStack_4037[uVar8] == '\0') break;
        } while (uVar8 < 0xfff);
        if (0xffe < uVar8) goto LAB_0010645f;
      }
      memcpy(local_9958.infile,&local_4038,uVar10);
      local_9958.infile[uVar10] = '\0';
      pcVar5 = strtok((char *)local_a958,".");
      strcpy(local_3038,pcVar5);
      pcVar5 = strtok((char *)0x0,".");
      while (pcVar5 != (char *)0x0) {
        strcat(local_3038,local_1038);
        sprintf(local_1038,".%s",pcVar5);
        pcVar5 = strtok((char *)0x0,".");
      }
      if (local_a988._1_1_ == '\x01') {
        sprintf(&local_5038,"%s/%s.%s",uVar3,local_3038,local_a998._8_8_);
        if (local_5038 == '\0') {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar8 = uVar10;
            uVar10 = uVar8 + 1;
            if (acStack_5037[uVar8] == '\0') break;
          } while (uVar8 < 0xfff);
          if (0xffe < uVar8) goto LAB_0010645f;
        }
        memcpy(local_9958.outfile,&local_5038,uVar10);
        local_9958.outfile[uVar10] = '\0';
      }
      goto LAB_00105ff1;
    }
LAB_0010645f:
    fwrite("skipping file...\n",0x11,1,_stderr);
LAB_00106297:
    local_a9ac = local_a9ac + 1;
  } while (local_a9ac != uVar11);
  iVar9 = 0;
  getrusage(RUSAGE_SELF,local_a958);
  if (local_a9a0 != 0) {
    auVar14._8_4_ = (int)((ulong)local_a9a0 >> 0x20);
    auVar14._0_8_ = local_a9a0;
    auVar14._12_4_ = 0x45300000;
    iVar9 = 0;
    fprintf(_stdout,"encode time: %d ms \n",
            (ulong)(uint)(int)(((((double)(local_a958[0].ru_utime.tv_usec +
                                          local_a958[0].ru_stime.tv_usec) * 1e-06 +
                                 (double)(local_a958[0].ru_utime.tv_sec +
                                         local_a958[0].ru_stime.tv_sec)) - local_a980) * 1000.0) /
                              ((auVar14._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)local_a9a0) - 4503599627370496.0))))
    ;
  }
LAB_00106797:
  if (local_9958.cp_comment != (char *)0x0) {
    free(local_9958.cp_comment);
  }
  if (local_9958.cp_matrice != (int *)0x0) {
    free(local_9958.cp_matrice);
  }
  if (local_a960 != (raw_comp_cparameters_t *)0x0) {
    free(local_a960);
  }
  if ((char *)local_a998._0_8_ != (char *)0x0) {
    free((void *)local_a998._0_8_);
  }
  if (local_a9b8 != (dircnt_t *)0x0) {
    if (local_a9b8->filename_buf != (char *)0x0) {
      free(local_a9b8->filename_buf);
    }
    if (local_a9b8->filename != (char **)0x0) {
      free(local_a9b8->filename);
    }
    free(local_a9b8);
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv)
{

    opj_cparameters_t parameters;   /* compression parameters */

    opj_stream_t *l_stream = 00;
    opj_codec_t* l_codec = 00;
    opj_image_t *image = NULL;
    raw_cparameters_t raw_cp;
    OPJ_SIZE_T num_compressed_files = 0;

    char indexfilename[OPJ_PATH_LEN];   /* index file name */

    unsigned int i, num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    int ret = 0;

    OPJ_BOOL bSuccess;
    OPJ_BOOL bUseTiles = OPJ_FALSE; /* OPJ_TRUE */
    OPJ_UINT32 l_nb_tiles = 4;
    OPJ_FLOAT64 t = opj_clock();

    /* set encoding parameters to default values */
    opj_set_default_encoder_parameters(&parameters);

    /* Initialize indexfilename and img_fol */
    *indexfilename = 0;
    memset(&img_fol, 0, sizeof(img_fol_t));

    /* raw_cp initialization */
    raw_cp.rawBitDepth = 0;
    raw_cp.rawComp = 0;
    raw_cp.rawComps = 0;
    raw_cp.rawHeight = 0;
    raw_cp.rawSigned = 0;
    raw_cp.rawWidth = 0;

    /* parse input and get user encoding parameters */
    parameters.tcp_mct = (char)
                         255; /* This will be set later according to the input image or the provided option */
    if (parse_cmdline_encoder(argc, argv, &parameters, &img_fol, &raw_cp,
                              indexfilename, sizeof(indexfilename)) == 1) {
        ret = 1;
        goto fin;
    }

    /* Read directory if necessary */
    if (img_fol.set_imgdir == 1) {
        num_images = get_num_images(img_fol.imgdirpath);
        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (dirptr) {
            dirptr->filename_buf = (char*)malloc(num_images * OPJ_PATH_LEN * sizeof(
                    char)); /* Stores at max 10 image file names*/
            dirptr->filename = (char**) malloc(num_images * sizeof(char*));
            if (!dirptr->filename_buf) {
                ret = 0;
                goto fin;
            }
            for (i = 0; i < num_images; i++) {
                dirptr->filename[i] = dirptr->filename_buf + i * OPJ_PATH_LEN;
            }
        }
        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            ret = 0;
            goto fin;
        }
        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            ret = 0;
            goto fin;
        }
    } else {
        num_images = 1;
    }
    /*Encoding image one by one*/
    for (imageno = 0; imageno < num_images; imageno++) {
        image = NULL;
        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file((int)imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        switch (parameters.decod_format) {
        case PGX_DFMT:
            break;
        case PXM_DFMT:
            break;
        case BMP_DFMT:
            break;
        case TIF_DFMT:
            break;
        case RAW_DFMT:
        case RAWL_DFMT:
            break;
        case TGA_DFMT:
            break;
        case PNG_DFMT:
            break;
        default:
            fprintf(stderr, "skipping file...\n");
            continue;
        }

        /* decode the source image */
        /* ----------------------- */

        switch (parameters.decod_format) {
        case PGX_DFMT:
            image = pgxtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pgx file\n");
                ret = 1;
                goto fin;
            }
            break;

        case PXM_DFMT:
            image = pnmtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pnm file\n");
                ret = 1;
                goto fin;
            }
            break;

        case BMP_DFMT:
            image = bmptoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load bmp file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBTIFF
        case TIF_DFMT:
            image = tiftoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tiff file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBTIFF */

        case RAW_DFMT:
            image = rawtoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case RAWL_DFMT:
            image = rawltoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case TGA_DFMT:
            image = tgatoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tga file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBPNG
        case PNG_DFMT:
            image = pngtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load png file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBPNG */
        }

        /* Can happen if input file is TIFF or PNG
        * and OPJ_HAVE_LIBTIF or OPJ_HAVE_LIBPNG is undefined
        */
        if (!image) {
            fprintf(stderr, "Unable to load file: got no image\n");
            ret = 1;
            goto fin;
        }

        /* Decide if MCT should be used */
        if (parameters.tcp_mct == (char)
                255) { /* mct mode has not been set in commandline */
            parameters.tcp_mct = (image->numcomps >= 3) ? 1 : 0;
        } else {            /* mct mode has been set in commandline */
            if ((parameters.tcp_mct == 1) && (image->numcomps < 3)) {
                fprintf(stderr, "RGB->YCC conversion cannot be used:\n");
                fprintf(stderr, "Input image has less than 3 components\n");
                ret = 1;
                goto fin;
            }
            if ((parameters.tcp_mct == 2) && (!parameters.mct_data)) {
                fprintf(stderr, "Custom MCT has been set but no array-based MCT\n");
                fprintf(stderr, "has been provided. Aborting.\n");
                ret = 1;
                goto fin;
            }
        }

        /* encode the destination image */
        /* ---------------------------- */

        switch (parameters.cod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_JP2);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        if (bUseTiles) {
            parameters.cp_tx0 = 0;
            parameters.cp_ty0 = 0;
            parameters.tile_size_on = OPJ_TRUE;
            parameters.cp_tdx = 512;
            parameters.cp_tdy = 512;
        }
        if (! opj_setup_encoder(l_codec, &parameters, image)) {
            fprintf(stderr, "failed to encode image: opj_setup_encoder\n");
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            ret = 1;
            goto fin;
        }

        /* open a byte stream for writing and allocate memory for all tiles */
        l_stream = opj_stream_create_default_file_stream(parameters.outfile, OPJ_FALSE);
        if (! l_stream) {
            ret = 1;
            goto fin;
        }

        /* encode the image */
        bSuccess = opj_start_compress(l_codec, image, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_start_compress\n");
        }
        if (bSuccess && bUseTiles) {
            OPJ_BYTE *l_data;
            OPJ_UINT32 l_data_size = 512 * 512 * 3;
            l_data = (OPJ_BYTE*) calloc(1, l_data_size);
            if (l_data == NULL) {
                ret = 1;
                goto fin;
            }
            for (i = 0; i < l_nb_tiles; ++i) {
                if (! opj_write_tile(l_codec, i, l_data, l_data_size, l_stream)) {
                    fprintf(stderr, "ERROR -> test_tile_encoder: failed to write the tile %d!\n",
                            i);
                    opj_stream_destroy(l_stream);
                    opj_destroy_codec(l_codec);
                    opj_image_destroy(image);
                    ret = 1;
                    goto fin;
                }
            }
            free(l_data);
        } else {
            bSuccess = bSuccess && opj_encode(l_codec, l_stream);
            if (!bSuccess)  {
                fprintf(stderr, "failed to encode image: opj_encode\n");
            }
        }
        bSuccess = bSuccess && opj_end_compress(l_codec, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_end_compress\n");
        }

        if (!bSuccess)  {
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fprintf(stderr, "failed to encode image\n");
            remove(parameters.outfile);
            ret = 1;
            goto fin;
        }

        num_compressed_files++;
        fprintf(stdout, "[INFO] Generated outfile %s\n", parameters.outfile);
        /* close and free the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining compression structures */
        opj_destroy_codec(l_codec);

        /* free image data */
        opj_image_destroy(image);

    }

    t = opj_clock() - t;
    if (num_compressed_files) {
        fprintf(stdout, "encode time: %d ms \n",
                (int)((t * 1000.0) / (OPJ_FLOAT64)num_compressed_files));
    }

    ret = 0;

fin:
    if (parameters.cp_comment) {
        free(parameters.cp_comment);
    }
    if (parameters.cp_matrice) {
        free(parameters.cp_matrice);
    }
    if (raw_cp.rawComps) {
        free(raw_cp.rawComps);
    }
    if (img_fol.imgdirpath) {
        free(img_fol.imgdirpath);
    }
    if (dirptr) {
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        free(dirptr);
    }
    return ret;
}